

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void GA_Freemem(void *ptr)

{
  long *plVar1;
  
  plVar1 = (long *)((long)ptr - (long)((int)GAnproc * 8 + 0x20));
  ARMCI_Free((void *)(plVar1[GAme + 4] - *plVar1));
  if (GA_memory_limited == '\x01') {
    GA_total_memory = GA_total_memory + plVar1[2];
  }
  return;
}

Assistant:

void GA_Freemem(void *ptr)
{
int extra = sizeof(getmem_t)+GAnproc*sizeof(char*); 
getmem_t *info = (getmem_t *)((char*)ptr - extra);
char **ptr_arr = (char**)(info+1);

#ifndef AVOID_MA_STORAGE
    if(ARMCI_Uses_shm()){
#endif
      /* make sure that we free original (before address alignment) pointer */
      ARMCI_Free(ptr_arr[GAme] - info->id);
#ifndef AVOID_MA_STORAGE
    }else{
      if(info->id != INVALID_MA_HANDLE) MA_free_heap(info->id);
    }
#endif

    if(GA_memory_limited) GA_total_memory += info->size;
}